

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode client_write_header(Curl_easy *data,char *buf,size_t blen)

{
  ulong uVar1;
  CURLcode CVar2;
  
  uVar1 = *(ulong *)&(data->set).field_0x8ca;
  *(ulong *)&(data->set).field_0x8ca = uVar1 | 0x1000000;
  CVar2 = Curl_client_write(data,4,buf,blen);
  *(ulong *)&(data->set).field_0x8ca =
       *(ulong *)&(data->set).field_0x8ca & 0xfffffffffeffffff | uVar1 & 0x1000000;
  return CVar2;
}

Assistant:

static CURLcode client_write_header(struct Curl_easy *data,
                                    char *buf, size_t blen)
{
  /* Some replies from an FTP server are written to the client
   * as CLIENTWRITE_HEADER, formatted as if they came from a
   * HTTP conversation.
   * In all protocols, CLIENTWRITE_HEADER data is only passed to
   * the body write callback when data->set.include_header is set
   * via CURLOPT_HEADER.
   * For historic reasons, FTP never played this game and expects
   * all its HEADERs to do that always. Set that flag during the
   * call to Curl_client_write() so it does the right thing.
   *
   * Notice that we cannot enable this flag for FTP in general,
   * as an FTP transfer might involve an HTTP proxy connection and
   * headers from CONNECT should not automatically be part of the
   * output. */
  CURLcode result;
  int save = data->set.include_header;
  data->set.include_header = TRUE;
  result = Curl_client_write(data, CLIENTWRITE_HEADER, buf, blen);
  data->set.include_header = save ? TRUE : FALSE;
  return result;
}